

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ResolveExprNames(NameContext *pNC,Expr *pExpr)

{
  Parse *pParse_00;
  int iVar1;
  Parse *pParse;
  Walker w;
  u16 savedHasAgg;
  Expr *pExpr_local;
  NameContext *pNC_local;
  
  if (pExpr == (Expr *)0x0) {
    pNC_local._4_4_ = 0;
  }
  else {
    pParse_00 = pNC->pParse;
    iVar1 = sqlite3ExprCheckHeight(pParse_00,pExpr->nHeight + pNC->pParse->nHeight);
    if (iVar1 == 0) {
      pParse_00->nHeight = pExpr->nHeight + pParse_00->nHeight;
      w.u._6_2_ = pNC->ncFlags & 0x1010;
      pNC->ncFlags = pNC->ncFlags & 0xefef;
      pParse = pNC->pParse;
      w.pParse = (Parse *)resolveExprStep;
      w.xExprCallback = resolveSelectStep;
      w.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
      w.xSelectCallback2._0_4_ = 0;
      w.xSelectCallback2._4_1_ = 0;
      w._32_8_ = pNC;
      sqlite3WalkExpr((Walker *)&pParse,pExpr);
      pNC->pParse->nHeight = pNC->pParse->nHeight - pExpr->nHeight;
      if ((0 < pNC->nErr) || (0 < pParse->nErr)) {
        pExpr->flags = pExpr->flags | 8;
      }
      if ((pNC->ncFlags & 0x10) != 0) {
        pExpr->flags = pExpr->flags | 2;
      }
      pNC->ncFlags = pNC->ncFlags | w.u._6_2_;
      pNC_local._4_4_ = (uint)((pExpr->flags & 8) != 0);
    }
    else {
      pNC_local._4_4_ = 1;
    }
  }
  return pNC_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ResolveExprNames( 
  NameContext *pNC,       /* Namespace to resolve expressions in. */
  Expr *pExpr             /* The expression to be analyzed. */
){
  u16 savedHasAgg;
  Walker w;

  if( pExpr==0 ) return 0;
#if SQLITE_MAX_EXPR_DEPTH>0
  {
    Parse *pParse = pNC->pParse;
    if( sqlite3ExprCheckHeight(pParse, pExpr->nHeight+pNC->pParse->nHeight) ){
      return 1;
    }
    pParse->nHeight += pExpr->nHeight;
  }
#endif
  savedHasAgg = pNC->ncFlags & (NC_HasAgg|NC_MinMaxAgg);
  pNC->ncFlags &= ~(NC_HasAgg|NC_MinMaxAgg);
  w.pParse = pNC->pParse;
  w.xExprCallback = resolveExprStep;
  w.xSelectCallback = resolveSelectStep;
  w.xSelectCallback2 = 0;
  w.walkerDepth = 0;
  w.eCode = 0;
  w.u.pNC = pNC;
  sqlite3WalkExpr(&w, pExpr);
#if SQLITE_MAX_EXPR_DEPTH>0
  pNC->pParse->nHeight -= pExpr->nHeight;
#endif
  if( pNC->nErr>0 || w.pParse->nErr>0 ){
    ExprSetProperty(pExpr, EP_Error);
  }
  if( pNC->ncFlags & NC_HasAgg ){
    ExprSetProperty(pExpr, EP_Agg);
  }
  pNC->ncFlags |= savedHasAgg;
  return ExprHasProperty(pExpr, EP_Error);
}